

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O2

Computed_Colors_Record_Data * __thiscall
OpenAmulet::Map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>_>::GetAt
          (Map<Am_Wrapper_*,_Computed_Colors_Record_Data_*,_std::less<Am_Wrapper_*>_> *this,
          Am_Wrapper **aKey)

{
  const_iterator cVar1;
  Computed_Colors_Record_Data **ppCVar2;
  
  cVar1 = std::
          _Rb_tree<Am_Wrapper_*,_std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>,_std::_Select1st<std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>_>,_std::less<Am_Wrapper_*>,_std::allocator<std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>_>_>
          ::find((_Rb_tree<Am_Wrapper_*,_std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>,_std::_Select1st<std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>_>,_std::less<Am_Wrapper_*>,_std::allocator<std::pair<Am_Wrapper_*const,_Computed_Colors_Record_Data_*>_>_>
                  *)this,aKey);
  ppCVar2 = &this->mDefaultReturn;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->mMap)._M_t._M_impl.super__Rb_tree_header) {
    ppCVar2 = (Computed_Colors_Record_Data **)&cVar1._M_node[1]._M_parent;
  }
  return *ppCVar2;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }